

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finalize.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  wasm_store_t *store;
  wasm_store_t *store_00;
  
  puts("Initializing...");
  uVar1 = wasm_engine_new();
  printf("Live count %d\n",(ulong)(uint)live_count);
  puts("Creating store 1...");
  store = (wasm_store_t *)wasm_store_new(uVar1);
  puts("Running in store 1...");
  run_in_store(store);
  printf("Live count %d\n",(ulong)(uint)live_count);
  puts("Creating store 2...");
  store_00 = (wasm_store_t *)wasm_store_new(uVar1);
  puts("Running in store 2...");
  run_in_store(store_00);
  printf("Live count %d\n",(ulong)(uint)live_count);
  puts("Deleting store 2...");
  wasm_store_delete(store_00);
  printf("Live count %d\n",(ulong)(uint)live_count);
  puts("Running in store 1...");
  run_in_store(store);
  printf("Live count %d\n",(ulong)(uint)live_count);
  puts("Deleting store 1...");
  wasm_store_delete(store);
  printf("Live count %d\n",(ulong)(uint)live_count);
  if (live_count == 0) {
    puts("Shutting down...");
    wasm_engine_delete(uVar1);
    puts("Done.");
    return 0;
  }
  __assert_fail("live_count == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/finalize.c"
                ,0x65,"int main(int, const char **)");
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();

  printf("Live count %d\n", live_count);
  printf("Creating store 1...\n");
  wasm_store_t* store1 = wasm_store_new(engine);

  printf("Running in store 1...\n");
  run_in_store(store1);
  printf("Live count %d\n", live_count);

  printf("Creating store 2...\n");
  wasm_store_t* store2 = wasm_store_new(engine);

  printf("Running in store 2...\n");
  run_in_store(store2);
  printf("Live count %d\n", live_count);

  printf("Deleting store 2...\n");
  wasm_store_delete(store2);
  printf("Live count %d\n", live_count);

  printf("Running in store 1...\n");
  run_in_store(store1);
  printf("Live count %d\n", live_count);

  printf("Deleting store 1...\n");
  wasm_store_delete(store1);
  printf("Live count %d\n", live_count);

  assert(live_count == 0);

  // Shut down.
  printf("Shutting down...\n");
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}